

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

char * kj::_::anon_unknown_0::DoubleToBuffer(double value,char *buffer)

{
  char *pcVar1;
  bool bVar2;
  float fVar3;
  bool local_da;
  bool local_d9;
  Fault local_c8;
  Fault f_1;
  int *local_b8;
  DebugComparison<int_&,_int> local_b0;
  bool local_85;
  int local_84;
  bool _kjCondition_1;
  double dStack_80;
  int snprintf_result2;
  double parsed_value;
  Fault local_68;
  Fault f;
  int *local_58;
  DebugComparison<int_&,_int> local_50;
  bool local_25;
  int local_24;
  bool _kjCondition;
  char *pcStack_20;
  int snprintf_result;
  char *buffer_local;
  double value_local;
  
  pcStack_20 = buffer;
  buffer_local = (char *)value;
  fVar3 = inf();
  pcVar1 = buffer_local;
  if ((value != (double)fVar3) || (NAN(value) || NAN((double)fVar3))) {
    fVar3 = inf();
    if (((double)pcVar1 != (double)-fVar3) || (NAN((double)pcVar1) || NAN((double)-fVar3))) {
      bVar2 = IsNaN((double)buffer_local);
      if (bVar2) {
        strcpy(pcStack_20,"nan");
        value_local = (double)pcStack_20;
      }
      else {
        local_24 = snprintf(pcStack_20,0x20,"%.*g",buffer_local,0xf);
        local_58 = (int *)DebugExpressionStart::operator<<
                                    ((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_24);
        f.exception._4_4_ = 0;
        DebugExpression<int&>::operator>
                  (&local_50,(DebugExpression<int&> *)&local_58,(int *)((long)&f.exception + 4));
        bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)&local_50);
        local_d9 = bVar2 && local_24 < 0x20;
        local_25 = local_d9;
        if (!bVar2 || local_24 >= 0x20) {
          Debug::Fault::Fault<kj::Exception::Type,bool&>
                    (&local_68,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                     ,0x1af,FAILED,"snprintf_result > 0 && snprintf_result < kDoubleToBufferSize",
                     "_kjCondition,",&local_25);
          Debug::Fault::fatal(&local_68);
        }
        dStack_80 = strtod(pcStack_20,(char **)0x0);
        if ((dStack_80 != (double)buffer_local) || (NAN(dStack_80) || NAN((double)buffer_local))) {
          local_84 = snprintf(pcStack_20,0x20,"%.*g",buffer_local,0x11);
          local_b8 = (int *)DebugExpressionStart::operator<<
                                      ((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_84);
          f_1.exception._4_4_ = 0;
          DebugExpression<int&>::operator>
                    (&local_b0,(DebugExpression<int&> *)&local_b8,(int *)((long)&f_1.exception + 4))
          ;
          bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)&local_b0);
          local_da = bVar2 && local_84 < 0x20;
          local_85 = local_da;
          if (!bVar2 || local_84 >= 0x20) {
            Debug::Fault::Fault<kj::Exception::Type,bool&>
                      (&local_c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string.c++"
                       ,0x1bd,FAILED,
                       "snprintf_result2 > 0 && snprintf_result2 < kDoubleToBufferSize",
                       "_kjCondition,",&local_85);
            Debug::Fault::fatal(&local_c8);
          }
        }
        DelocalizeRadix(pcStack_20);
        RemovePlus(pcStack_20);
        value_local = (double)pcStack_20;
      }
    }
    else {
      strcpy(pcStack_20,"-inf");
      value_local = (double)pcStack_20;
    }
  }
  else {
    strcpy(pcStack_20,"inf");
    value_local = (double)pcStack_20;
  }
  return (char *)value_local;
}

Assistant:

char* DoubleToBuffer(double value, char* buffer) {
  // DBL_DIG is 15 for IEEE-754 doubles, which are used on almost all
  // platforms these days.  Just in case some system exists where DBL_DIG
  // is significantly larger -- and risks overflowing our buffer -- we have
  // this assert.
  static_assert(DBL_DIG < 20, "DBL_DIG is too big.");

  if (value == inf()) {
    strcpy(buffer, "inf");
    return buffer;
  } else if (value == -inf()) {
    strcpy(buffer, "-inf");
    return buffer;
  } else if (IsNaN(value)) {
    strcpy(buffer, "nan");
    return buffer;
  }

  int snprintf_result KJ_UNUSED =
    snprintf(buffer, kDoubleToBufferSize, "%.*g", DBL_DIG, value);

  // The snprintf should never overflow because the buffer is significantly
  // larger than the precision we asked for.
  KJ_DASSERT(snprintf_result > 0 && snprintf_result < kDoubleToBufferSize);

  // We need to make parsed_value volatile in order to force the compiler to
  // write it out to the stack.  Otherwise, it may keep the value in a
  // register, and if it does that, it may keep it as a long double instead
  // of a double.  This long double may have extra bits that make it compare
  // unequal to "value" even though it would be exactly equal if it were
  // truncated to a double.
  volatile double parsed_value = strtod(buffer, NULL);
  if (parsed_value != value) {
    int snprintf_result2 KJ_UNUSED =
      snprintf(buffer, kDoubleToBufferSize, "%.*g", DBL_DIG+2, value);

    // Should never overflow; see above.
    KJ_DASSERT(snprintf_result2 > 0 && snprintf_result2 < kDoubleToBufferSize);
  }

  DelocalizeRadix(buffer);
  RemovePlus(buffer);
#if _WIN32
  RemoveE0(buffer);
#endif // _WIN32
  return buffer;
}